

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lottieitem.cpp
# Opt level: O1

void __thiscall rlottie::internal::renderer::ImageLayer::updateContent(ImageLayer *this)

{
  VPath *this_00;
  DirtyFlag *pDVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  Extra *pEVar4;
  Asset *pAVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  VPathData *pVVar13;
  size_t in_RCX;
  void *in_RDX;
  void *__buf;
  void *__buf_00;
  int __fd;
  int in_ESI;
  VMatrix local_48;
  
  __fd = (int)&local_48;
  pEVar4 = (((this->super_Layer).mLayerData)->mExtra)._M_t.
           super___uniq_ptr_impl<rlottie::internal::model::Layer::Extra,_std::default_delete<rlottie::internal::model::Layer::Extra>_>
           ._M_t.
           super__Tuple_impl<0UL,_rlottie::internal::model::Layer::Extra_*,_std::default_delete<rlottie::internal::model::Layer::Extra>_>
           .super__Head_base<0UL,_rlottie::internal::model::Layer::Extra_*,_false>._M_head_impl;
  if ((pEVar4 != (Extra *)0x0) && (pEVar4->mAsset != (Asset *)0x0)) {
    if (((this->super_Layer).mDirtyFlag.i & 1) != 0) {
      this_00 = &this->mPath;
      pVVar13 = (VPathData *)vcow_ptr<VPath::VPathData>::write(&this_00->d,in_ESI,in_RDX,in_RCX);
      VPath::VPathData::reset(pVVar13);
      pAVar5 = ((((this->super_Layer).mLayerData)->mExtra)._M_t.
                super___uniq_ptr_impl<rlottie::internal::model::Layer::Extra,_std::default_delete<rlottie::internal::model::Layer::Extra>_>
                ._M_t.
                super__Tuple_impl<0UL,_rlottie::internal::model::Layer::Extra_*,_std::default_delete<rlottie::internal::model::Layer::Extra>_>
                .super__Head_base<0UL,_rlottie::internal::model::Layer::Extra_*,_false>._M_head_impl
               )->mAsset;
      local_48.m11 = 0.0;
      local_48.m12 = 0.0;
      uVar2 = pAVar5->mWidth;
      uVar3 = pAVar5->mHeight;
      local_48.m21 = (float)(int)uVar3;
      local_48.m13 = (float)(int)uVar2;
      pVVar13 = (VPathData *)vcow_ptr<VPath::VPathData>::write(&this_00->d,in_ESI,__buf,in_RCX);
      VPath::VPathData::addRect(pVVar13,(VRectF *)&local_48,CW);
      local_48.m33 = (this->super_Layer).mCombinedMatrix.m33;
      local_48.mType = (this->super_Layer).mCombinedMatrix.mType;
      local_48.dirty = (this->super_Layer).mCombinedMatrix.dirty;
      local_48._38_2_ = *(undefined2 *)&(this->super_Layer).mCombinedMatrix.field_0x26;
      local_48.m11 = (this->super_Layer).mCombinedMatrix.m11;
      local_48.m12 = (this->super_Layer).mCombinedMatrix.m12;
      local_48.m13 = (this->super_Layer).mCombinedMatrix.m13;
      local_48.m21 = (this->super_Layer).mCombinedMatrix.m21;
      local_48.m22 = (this->super_Layer).mCombinedMatrix.m22;
      local_48.m23 = (this->super_Layer).mCombinedMatrix.m23;
      local_48.mtx = (this->super_Layer).mCombinedMatrix.mtx;
      local_48.mty = (this->super_Layer).mCombinedMatrix.mty;
      pVVar13 = (VPathData *)vcow_ptr<VPath::VPathData>::write(&this_00->d,__fd,__buf_00,in_RCX);
      VPath::VPathData::transform(pVVar13,&local_48);
      pDVar1 = &(this->mRenderNode).super_VDrawable.mFlag;
      *(byte *)&pDVar1->i = (byte)pDVar1->i | 2;
      vcow_ptr<VPath::VPathData>::operator=
                ((vcow_ptr<VPath::VPathData> *)&this->mRenderNode,&this_00->d);
      fVar6 = (this->super_Layer).mCombinedMatrix.m12;
      fVar7 = (this->super_Layer).mCombinedMatrix.m13;
      fVar8 = (this->super_Layer).mCombinedMatrix.m21;
      fVar9 = (this->super_Layer).mCombinedMatrix.m22;
      fVar10 = (this->super_Layer).mCombinedMatrix.m23;
      fVar11 = (this->super_Layer).mCombinedMatrix.mtx;
      fVar12 = (this->super_Layer).mCombinedMatrix.mty;
      (this->mTexture).mMatrix.m11 = (this->super_Layer).mCombinedMatrix.m11;
      (this->mTexture).mMatrix.m12 = fVar6;
      (this->mTexture).mMatrix.m13 = fVar7;
      (this->mTexture).mMatrix.m21 = fVar8;
      (this->mTexture).mMatrix.m22 = fVar9;
      (this->mTexture).mMatrix.m23 = fVar10;
      (this->mTexture).mMatrix.mtx = fVar11;
      (this->mTexture).mMatrix.mty = fVar12;
      *(undefined8 *)((long)&(this->mTexture).mMatrix.mty + 2) =
           *(undefined8 *)((long)&(this->super_Layer).mCombinedMatrix.mty + 2);
    }
    if (((this->super_Layer).mDirtyFlag.i & 2) != 0) {
      (this->mTexture).mAlpha = (int)((this->super_Layer).mCombinedAlpha * 255.0);
    }
  }
  return;
}

Assistant:

void renderer::ImageLayer::updateContent()
{
    if (!mLayerData->asset()) return;

    if (flag() & DirtyFlagBit::Matrix) {
        mPath.reset();
        mPath.addRect(VRectF(0, 0, mLayerData->asset()->mWidth,
                            mLayerData->asset()->mHeight));
        mPath.transform(combinedMatrix());
        mRenderNode.mFlag |= VDrawable::DirtyState::Path;
        mRenderNode.mPath = mPath;
        mTexture.mMatrix = combinedMatrix();
    }

    if (flag() & DirtyFlagBit::Alpha) {
        mTexture.mAlpha = int(combinedAlpha() * 255);
    }
}